

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::panic(torrent *this)

{
  disk_interface *pdVar1;
  peer_list *this_00;
  pointer pppVar2;
  
  pdVar1 = (this->m_storage).m_disk_io;
  if (pdVar1 != (disk_interface *)0x0) {
    (*pdVar1->_vptr_disk_interface[1])(pdVar1,(ulong)(this->m_storage).m_idx.m_val);
  }
  (this->m_storage).m_disk_io = (disk_interface *)0x0;
  this_00 = (this->super_torrent_hot_members).m_peer_list._M_t.
            super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
            .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
  if (this_00 != (peer_list *)0x0) {
    peer_list::clear(this_00);
  }
  pppVar2 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_torrent_hot_members).m_connections.
      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      .
      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != pppVar2) {
    (this->super_torrent_hot_members).m_connections.
    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    .
    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = pppVar2;
  }
  ::std::
  _Rb_tree<libtorrent::digest32<160L>,_libtorrent::digest32<160L>,_std::_Identity<libtorrent::digest32<160L>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<libtorrent::digest32<160L>_>_>
  ::clear(&(this->m_outgoing_pids)._M_t);
  ::std::
  vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ::clear(&this->m_peers_to_disconnect);
  *(uint *)&this->field_0x5d8 = (uint)(byte)this->field_0x5db << 0x18;
  this->m_num_connecting = 0;
  this->m_num_connecting_seeds = 0;
  return;
}

Assistant:

void torrent::panic()
	{
		m_storage.reset();
		// if there are any other peers allocated still, we need to clear them
		// now. They can't be cleared later because the allocator will already
		// have been destructed
		if (m_peer_list) m_peer_list->clear();
		m_connections.clear();
		m_outgoing_pids.clear();
		m_peers_to_disconnect.clear();
		m_num_uploads = 0;
		m_num_connecting = 0;
		m_num_connecting_seeds = 0;
	}